

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexMatch.cpp
# Opt level: O2

unique_ptr<const_oout::Result,_std::default_delete<const_oout::Result>_> __thiscall
oout::RegexMatch::match(RegexMatch *this,shared_ptr<const_oout::Text> *in)

{
  undefined1 auVar1 [8];
  ostream *poVar2;
  undefined8 *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__s;
  undefined1 local_201 [9];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1f8;
  undefined1 local_1f0 [8];
  string origin;
  string local_1c8 [32];
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_1a8;
  ostringstream message;
  
  (**(code **)(*(long *)*in_RDX + 0x10))(&origin);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&message);
  poVar2 = std::operator<<((ostream *)&message,"\'");
  poVar2 = std::operator<<(poVar2,(string *)&origin);
  poVar2 = std::operator<<(poVar2,"\' match with \'");
  __s = &(in->super___shared_ptr<const_oout::Text,_(__gnu_cxx::_Lock_policy)2>)._M_refcount;
  poVar2 = std::operator<<(poVar2,(string *)__s);
  std::operator<<(poVar2,"\'");
  std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
  basic_regex<std::char_traits<char>,std::allocator<char>>
            ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&local_1a8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__s,0x10);
  local_201[0] = std::
                 regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                           (&origin,&local_1a8,0);
  std::__cxx11::stringbuf::str();
  std::make_shared<oout::CondResult,bool,std::__cxx11::string>
            ((bool *)(local_201 + 1),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_201);
  std::make_unique<oout::TestResult,std::shared_ptr<oout::CondResult>>
            ((shared_ptr<oout::CondResult> *)local_1f0);
  auVar1 = local_1f0;
  local_1f0 = (undefined1  [8])0x0;
  (this->super_Match)._vptr_Match = (_func_int **)auVar1;
  std::unique_ptr<oout::TestResult,_std::default_delete<oout::TestResult>_>::~unique_ptr
            ((unique_ptr<oout::TestResult,_std::default_delete<oout::TestResult>_> *)local_1f0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1f8);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_1a8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&message);
  std::__cxx11::string::~string((string *)&origin);
  return (__uniq_ptr_data<const_oout::Result,_std::default_delete<const_oout::Result>,_true,_true>)
         (__uniq_ptr_data<const_oout::Result,_std::default_delete<const_oout::Result>,_true,_true>)
         this;
}

Assistant:

unique_ptr<const Result> RegexMatch::match(const shared_ptr<const Text> &in) const
{
	const auto origin = in->asString();
	ostringstream message;
	message << "'" << origin << "' match with '" << re << "'";

	return make_unique<TestResult>(
		make_shared<CondResult>(regex_search(origin, regex(re)), message.str())
	);
}